

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

format_error * __thiscall
boost::runtime::specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
operator<<(specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *this,
          char *val)

{
  long in_RSI;
  format_error *in_RDI;
  format_error *in_stack_ffffffffffffffc8;
  format_error *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::append((char *)(in_RSI + 0x18));
  format_error::format_error(this_00,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }